

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ExpressionAnalyzer.cpp
# Opt level: O3

bool wasm::ExpressionAnalyzer::isResultUsed(ExpressionStack *stack,Function *func)

{
  Id IVar1;
  pointer ppEVar2;
  Expression *pEVar3;
  Expression *pEVar4;
  uintptr_t uVar5;
  bool bVar6;
  array<wasm::Expression_*,_10UL> *paVar7;
  array<wasm::Expression_*,_10UL> *paVar8;
  int iVar9;
  ulong uVar10;
  array<wasm::Expression_*,_10UL> *paVar11;
  uintptr_t uVar12;
  Signature SVar13;
  
  ppEVar2 = (stack->flexible).
            super__Vector_base<wasm::Expression_*,_std::allocator<wasm::Expression_*>_>._M_impl.
            super__Vector_impl_data._M_start;
  iVar9 = (int)((ulong)((long)(stack->flexible).
                              super__Vector_base<wasm::Expression_*,_std::allocator<wasm::Expression_*>_>
                              ._M_impl.super__Vector_impl_data._M_finish - (long)ppEVar2) >> 3) +
          (int)stack->usedFixed;
  if (1 < iVar9) {
    paVar8 = (array<wasm::Expression_*,_10UL> *)(ppEVar2 + -10);
    uVar10 = (ulong)(iVar9 - 2);
    do {
      paVar7 = paVar8;
      if (uVar10 < 10) {
        paVar7 = &stack->fixed;
      }
      paVar11 = paVar8;
      if (uVar10 < 9) {
        paVar11 = &stack->fixed;
      }
      pEVar3 = paVar7->_M_elems[uVar10];
      pEVar4 = paVar11->_M_elems[uVar10 + 1];
      IVar1 = pEVar3->_id;
      if (IVar1 == BlockId) {
        uVar5 = pEVar3[2].type.id;
        if (uVar5 != 1) {
          uVar12 = 0;
          do {
            if (uVar5 == uVar12) {
              __assert_fail("index < usedElements",
                            "/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]binaryen/src/mixed_arena.h"
                            ,0xbc,
                            "T &ArenaVectorBase<ArenaVector<wasm::Expression *>, wasm::Expression *>::operator[](size_t) const [SubType = ArenaVector<wasm::Expression *>, T = wasm::Expression *]"
                           );
            }
            if (*(Expression **)(*(long *)(pEVar3 + 2) + uVar12 * 8) == pEVar4) {
              return false;
            }
            uVar12 = uVar12 + 1;
          } while (uVar5 - 1 != uVar12);
          if (uVar5 == 0) {
            __assert_fail("usedElements > 0",
                          "/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]binaryen/src/mixed_arena.h"
                          ,0xd0,
                          "T &ArenaVectorBase<ArenaVector<wasm::Expression *>, wasm::Expression *>::back() const [SubType = ArenaVector<wasm::Expression *>, T = wasm::Expression *]"
                         );
          }
        }
        if (*(Expression **)(*(long *)(pEVar3 + 2) + -8 + uVar5 * 8) != pEVar4) {
          __assert_fail("block->list.back() == above",
                        "/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]binaryen/src/ir/ExpressionAnalyzer.cpp"
                        ,0x2b,
                        "static bool wasm::ExpressionAnalyzer::isResultUsed(ExpressionStack &, Function *)"
                       );
        }
      }
      else {
        if (IVar1 != IfId) {
          if (IVar1 == DropId) {
            return false;
          }
          return true;
        }
        if (pEVar4 == *(Expression **)(pEVar3 + 1)) {
          return true;
        }
        if (*(Expression **)(pEVar3 + 2) == (Expression *)0x0) {
          return false;
        }
        if ((pEVar4 != *(Expression **)(pEVar3 + 2)) && (pEVar4 != (Expression *)pEVar3[1].type.id))
        {
          __assert_fail("above == iff->ifTrue || above == iff->ifFalse",
                        "/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]binaryen/src/ir/ExpressionAnalyzer.cpp"
                        ,0x35,
                        "static bool wasm::ExpressionAnalyzer::isResultUsed(ExpressionStack &, Function *)"
                       );
        }
      }
      bVar6 = 0 < (long)uVar10;
      uVar10 = uVar10 - 1;
    } while (bVar6);
  }
  SVar13 = HeapType::getSignature(&func->type);
  return SVar13.results.id.id != 0;
}

Assistant:

bool ExpressionAnalyzer::isResultUsed(ExpressionStack& stack, Function* func) {
  for (int i = int(stack.size()) - 2; i >= 0; i--) {
    auto* curr = stack[i];
    auto* above = stack[i + 1];
    // only if and block can drop values (pre-drop expression was added) FIXME
    if (curr->is<Block>()) {
      auto* block = curr->cast<Block>();
      for (size_t j = 0; j < block->list.size() - 1; j++) {
        if (block->list[j] == above) {
          return false;
        }
      }
      assert(block->list.back() == above);
      // continue down
    } else if (curr->is<If>()) {
      auto* iff = curr->cast<If>();
      if (above == iff->condition) {
        return true;
      }
      if (!iff->ifFalse) {
        return false;
      }
      assert(above == iff->ifTrue || above == iff->ifFalse);
      // continue down
    } else {
      if (curr->is<Drop>()) {
        return false;
      }
      return true; // all other node types use the result
    }
  }
  // The value might be used, so it depends on if the function returns
  return func->getResults() != Type::none;
}